

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_server.c
# Opt level: O0

mk_list * mk_server_listen_init(mk_server *server)

{
  int sockfd;
  int iVar1;
  mk_list **ppmVar2;
  int *piVar3;
  mk_sched_handler *pmVar4;
  mk_plugin *pmVar5;
  mk_list *__mptr;
  mk_config_listener *listen;
  mk_plugin *plugin;
  mk_sched_handler *protocol;
  mk_server_listen *listener;
  mk_event *event;
  mk_list *listeners;
  mk_list *head;
  int reuse_port;
  int server_fd;
  mk_server *server_local;
  
  if (server == (mk_server *)0x0) {
    server_local = (mk_server *)0x0;
  }
  else {
    server_local = (mk_server *)mk_mem_alloc(0x10);
    mk_list_init((mk_list *)server_local);
    head._0_4_ = (uint)(server->scheduler_mode == '\x01');
    for (listeners = (server->listeners).next; listeners != &server->listeners;
        listeners = listeners->next) {
      ppmVar2 = &listeners[-2].next;
      sockfd = mk_socket_server((char *)listeners[-1].prev,(char *)*ppmVar2,(uint)head,server);
      if (sockfd < 0) {
        mk_print(0x1001,"[server] Failed to bind server socket to %s:%s.",*ppmVar2,
                 listeners[-1].prev);
        return (mk_list *)0x0;
      }
      iVar1 = mk_socket_set_tcp_defer_accept(sockfd);
      if (iVar1 != 0) {
        mk_print(0x1002,"[server] Could not set TCP_DEFER_ACCEPT");
      }
      piVar3 = (int *)mk_mem_alloc_z(0x78);
      *piVar3 = sockfd;
      piVar3[1] = 1;
      piVar3[2] = 0;
      *(undefined1 *)(piVar3 + 3) = 1;
      piVar3[0x12] = sockfd;
      *(mk_list ***)(piVar3 + 0x18) = ppmVar2;
      if (((ulong)listeners[-1].next & 1) != 0) {
        pmVar4 = mk_sched_handler_cap('\x01');
        if (pmVar4 == (mk_sched_handler *)0x0) {
          mk_print(0x1001,"HTTP protocol not supported");
          exit(1);
        }
        *(mk_sched_handler **)(piVar3 + 0x16) = pmVar4;
      }
      pmVar5 = mk_plugin_cap('\x04',server);
      *(mk_plugin **)(piVar3 + 0x14) = pmVar5;
      if (((ulong)listeners[-1].next & 8) != 0) {
        pmVar5 = mk_plugin_cap('\b',server);
        if (pmVar5 == (mk_plugin *)0x0) {
          mk_print(0x1001,"SSL/TLS not supported");
          exit(1);
        }
        *(mk_plugin **)(piVar3 + 0x14) = pmVar5;
      }
      mk_list_add((mk_list *)(piVar3 + 0x1a),(mk_list *)server_local);
    }
    if ((uint)head == 1) {
      pthread_setspecific(mk_tls_server_listen,server_local);
    }
  }
  return (mk_list *)server_local;
}

Assistant:

struct mk_list *mk_server_listen_init(struct mk_server *server)
{
    int server_fd;
    int reuse_port = MK_FALSE;
    struct mk_list *head;
    struct mk_list *listeners;
    struct mk_event *event;
    struct mk_server_listen *listener;
    struct mk_sched_handler *protocol;
    struct mk_plugin *plugin;
    struct mk_config_listener *listen;

    if (!server) {
        goto error;
    }

    listeners = mk_mem_alloc(sizeof(struct mk_list));
    mk_list_init(listeners);

    if (server->scheduler_mode == MK_SCHEDULER_REUSEPORT) {
        reuse_port = MK_TRUE;
    }

    mk_list_foreach(head, &server->listeners) {
        listen = mk_list_entry(head, struct mk_config_listener, _head);

        server_fd = mk_socket_server(listen->port,
                                     listen->address,
                                     reuse_port,
                                     server);
        if (server_fd >= 0) {
            if (mk_socket_set_tcp_defer_accept(server_fd) != 0) {
#if defined (__linux__)
                mk_warn("[server] Could not set TCP_DEFER_ACCEPT");
#endif
            }

            listener = mk_mem_alloc_z(sizeof(struct mk_server_listen));

            /* configure the internal event_state */
            event = &listener->event;
            event->fd   = server_fd;
            event->type = MK_EVENT_LISTENER;
            event->mask = MK_EVENT_EMPTY;
            event->status = MK_EVENT_NONE;

            /* continue with listener setup and linking */
            listener->server_fd = server_fd;
            listener->listen    = listen;

            if (listen->flags & MK_CAP_HTTP) {
                protocol = mk_sched_handler_cap(MK_CAP_HTTP);
                if (!protocol) {
                    mk_err("HTTP protocol not supported");
                    exit(EXIT_FAILURE);
                }
                listener->protocol = protocol;
            }

#ifdef MK_HAVE_HTTP2
            if (listen->flags & MK_CAP_HTTP2) {
                protocol = mk_sched_handler_cap(MK_CAP_HTTP2);
                if (!protocol) {
                    mk_err("HTTP2 protocol not supported");
                    exit(EXIT_FAILURE);
                }
                listener->protocol = protocol;
            }
#endif
            listener->network = mk_plugin_cap(MK_CAP_SOCK_PLAIN, server);

            if (listen->flags & MK_CAP_SOCK_TLS) {
                plugin = mk_plugin_cap(MK_CAP_SOCK_TLS, server);
                if (!plugin) {
                    mk_err("SSL/TLS not supported");
                    exit(EXIT_FAILURE);
                }
                listener->network = plugin;
            }

            mk_list_add(&listener->_head, listeners);
        }
        else {
            mk_err("[server] Failed to bind server socket to %s:%s.",
                   listen->address,
                   listen->port);
            return NULL;
        }
    }

    if (reuse_port == MK_TRUE) {
        MK_TLS_SET(mk_tls_server_listen, listeners);
    }

    return listeners;

error:
    return NULL;
}